

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O3

void __thiscall hrgls::API::~API(API *this)

{
  API_private *pAVar1;
  
  pAVar1 = this->m_private;
  if (pAVar1 != (API_private *)0x0) {
    if (200 < pAVar1->verbosity) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"API::~API(): Destroying API:",0x1c);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      pAVar1 = this->m_private;
    }
    pAVar1->quitThread = true;
    std::thread::join();
    pAVar1 = this->m_private;
    if (pAVar1 != (API_private *)0x0) {
      std::__cxx11::_List_base<hrgls::Message,_std::allocator<hrgls::Message>_>::_M_clear
                (&(pAVar1->storedMessages).
                  super__List_base<hrgls::Message,_std::allocator<hrgls::Message>_>);
      if ((pAVar1->myThread)._M_id._M_thread != 0) {
        std::terminate();
      }
      std::
      vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>::
      ~vector(&pAVar1->rends);
      std::
      _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
      ::~_Rb_tree(&(pAVar1->status)._M_t);
      goto LAB_00106065;
    }
  }
  pAVar1 = (API_private *)0x0;
LAB_00106065:
  operator_delete(pAVar1);
  return;
}

Assistant:

API::~API()
  {
    // Stop my thread.
    if (m_private) {
        if (m_private->verbosity > 200) {
          std::cout << "API::~API(): Destroying API:" << std::endl;
        }
        m_private->quitThread = true;
        m_private->myThread.join();
    }

    delete m_private;
  }